

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8.h
# Opt level: O1

void ncnn::conv3x3s1_winograd64_transform_kernel_pack8_avx
               (Mat *kernel,Mat *kernel_tm_pack8,int inch,int outch,Option *opt)

{
  undefined4 *puVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  undefined4 uVar6;
  float fVar7;
  uint uVar8;
  void *pvVar9;
  size_t sVar10;
  size_t sVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int *piVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  int i;
  long lVar32;
  undefined4 *puVar33;
  long lVar34;
  ulong uVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  int iVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  undefined4 *puVar48;
  undefined4 *puVar49;
  long lVar50;
  int j;
  long lVar51;
  long lVar52;
  long lVar53;
  undefined8 *puVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar70 [16];
  undefined8 uVar69;
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  Mat kernel_tm;
  float tmp [8] [3];
  long local_2b0;
  undefined4 *local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  long local_288;
  long local_280;
  long local_278;
  long local_270;
  Mat local_e8;
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  undefined1 local_58 [32];
  
  local_e8.cstep = 0;
  local_e8.data = (undefined4 *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elemsize._0_4_ = 0;
  local_e8.elemsize._4_4_ = 0;
  local_e8.elempack = 0;
  local_e8.allocator = (Allocator *)0x0;
  local_e8.dims = 0;
  local_e8.w = 0;
  local_e8.h = 0;
  local_e8.d = 0;
  local_e8.c = 0;
  Mat::create(&local_e8,0x40,inch,outch,4,(Allocator *)0x0);
  if (0 < outch) {
    pvVar9 = kernel->data;
    auVar12 = vblendps_avx(_DAT_00318c00,_DAT_00318c20,0x92);
    auVar12 = vblendps_avx(auVar12,_DAT_00318c40,0x24);
    auVar14 = vpermps_avx2(_DAT_00318d00,auVar12);
    auVar12 = vblendps_avx(_DAT_00318c00,_DAT_00318c20,0x24);
    auVar12 = vblendps_avx(auVar12,_DAT_00318c40,0x49);
    auVar15 = vpermps_avx2(_DAT_00318d20,auVar12);
    auVar12 = vblendps_avx(_DAT_00318c20,_DAT_00318c00,0x24);
    auVar16 = vpermps_avx2(_DAT_00318d40,auVar12);
    auVar12 = vshufps_avx(_DAT_00318c40,_DAT_00318c40,0xc4);
    auVar12 = vpermpd_avx2(auVar12,0xc4);
    auVar12 = vblendps_avx(auVar16,auVar12,0xe0);
    uVar35 = 0;
    do {
      if (0 < inch) {
        iVar41 = inch * 9 * (int)uVar35;
        puVar48 = (undefined4 *)
                  (local_e8.cstep * uVar35 *
                   CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) +
                  (long)local_e8.data);
        uVar29 = 0;
        do {
          fVar2 = *(float *)((long)pvVar9 + uVar29 * 0x24 + (long)iVar41 * 4);
          uVar3 = *(undefined4 *)((long)pvVar9 + uVar29 * 0x24 + (long)iVar41 * 4 + 4);
          auVar67._4_4_ = uVar3;
          auVar67._0_4_ = uVar3;
          auVar67._8_4_ = uVar3;
          auVar67._12_4_ = uVar3;
          auVar67._16_4_ = uVar3;
          auVar67._20_4_ = uVar3;
          auVar67._24_4_ = uVar3;
          auVar67._28_4_ = uVar3;
          uVar4 = *(undefined4 *)((long)pvVar9 + uVar29 * 0x24 + (long)iVar41 * 4 + 8);
          auVar71._4_4_ = uVar4;
          auVar71._0_4_ = uVar4;
          auVar71._8_4_ = uVar4;
          auVar71._12_4_ = uVar4;
          auVar71._16_4_ = uVar4;
          auVar71._20_4_ = uVar4;
          auVar71._24_4_ = uVar4;
          auVar71._28_4_ = uVar4;
          fVar5 = *(float *)((long)pvVar9 + uVar29 * 0x24 + (long)iVar41 * 4 + 0xc);
          uVar6 = *(undefined4 *)((long)pvVar9 + uVar29 * 0x24 + (long)iVar41 * 4 + 0x10);
          auVar72._4_4_ = uVar6;
          auVar72._0_4_ = uVar6;
          auVar72._8_4_ = uVar6;
          auVar72._12_4_ = uVar6;
          auVar72._16_4_ = uVar6;
          auVar72._20_4_ = uVar6;
          auVar72._24_4_ = uVar6;
          auVar72._28_4_ = uVar6;
          uVar6 = *(undefined4 *)((long)pvVar9 + uVar29 * 0x24 + (long)iVar41 * 4 + 0x14);
          auVar74._4_4_ = uVar6;
          auVar74._0_4_ = uVar6;
          auVar74._8_4_ = uVar6;
          auVar74._12_4_ = uVar6;
          auVar74._16_4_ = uVar6;
          auVar74._20_4_ = uVar6;
          auVar74._24_4_ = uVar6;
          auVar74._28_4_ = uVar6;
          fVar7 = *(float *)((long)pvVar9 + uVar29 * 0x24 + (long)iVar41 * 4 + 0x18);
          uVar6 = *(undefined4 *)((long)pvVar9 + uVar29 * 0x24 + (long)iVar41 * 4 + 0x1c);
          auVar75._4_4_ = uVar6;
          auVar75._0_4_ = uVar6;
          auVar75._8_4_ = uVar6;
          auVar75._12_4_ = uVar6;
          auVar75._16_4_ = uVar6;
          auVar75._20_4_ = uVar6;
          auVar75._24_4_ = uVar6;
          auVar75._28_4_ = uVar6;
          uVar6 = *(undefined4 *)((long)pvVar9 + uVar29 * 0x24 + (long)iVar41 * 4 + 0x20);
          auVar76._4_4_ = uVar6;
          auVar76._0_4_ = uVar6;
          auVar76._8_4_ = uVar6;
          auVar76._12_4_ = uVar6;
          auVar76._16_4_ = uVar6;
          auVar76._20_4_ = uVar6;
          auVar76._24_4_ = uVar6;
          auVar76._28_4_ = uVar6;
          fVar60 = auVar14._0_4_;
          fVar61 = auVar14._4_4_;
          auVar16._4_4_ = fVar61 * fVar2;
          auVar16._0_4_ = fVar60 * fVar2;
          fVar62 = auVar14._8_4_;
          auVar16._8_4_ = fVar62 * fVar2;
          fVar63 = auVar14._12_4_;
          auVar16._12_4_ = fVar63 * fVar2;
          fVar64 = auVar14._16_4_;
          auVar16._16_4_ = fVar64 * fVar2;
          fVar65 = auVar14._20_4_;
          auVar16._20_4_ = fVar65 * fVar2;
          fVar66 = auVar14._24_4_;
          auVar16._24_4_ = fVar66 * fVar2;
          auVar16._28_4_ = fVar2;
          auVar70 = vfmadd231ps_fma(auVar16,auVar15,auVar67);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar70),auVar12,auVar71);
          auVar13._4_4_ = fVar5 * fVar61;
          auVar13._0_4_ = fVar5 * fVar60;
          auVar13._8_4_ = fVar5 * fVar62;
          auVar13._12_4_ = fVar5 * fVar63;
          auVar13._16_4_ = fVar5 * fVar64;
          auVar13._20_4_ = fVar5 * fVar65;
          auVar13._24_4_ = fVar5 * fVar66;
          auVar13._28_4_ = uVar3;
          auVar70 = vfmadd231ps_fma(auVar13,auVar15,auVar72);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar70),auVar12,auVar74);
          auVar68._4_4_ = fVar7 * fVar61;
          auVar68._0_4_ = fVar7 * fVar60;
          auVar68._8_4_ = fVar7 * fVar62;
          auVar68._12_4_ = fVar7 * fVar63;
          auVar68._16_4_ = fVar7 * fVar64;
          auVar68._20_4_ = fVar7 * fVar65;
          auVar68._24_4_ = fVar7 * fVar66;
          auVar68._28_4_ = uVar4;
          auVar70 = vfmadd231ps_fma(auVar68,auVar15,auVar75);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar70),auVar12,auVar76);
          auVar16 = vpermpd_avx2(ZEXT1632(auVar17),0x60);
          auVar70 = vshufps_avx(auVar18,auVar18,0xa1);
          auVar13 = vpermpd_avx2(ZEXT1632(auVar70),0x44);
          auVar16 = vblendps_avx(auVar16,auVar13,0x92);
          uVar69 = auVar19._0_8_;
          auVar73._8_8_ = uVar69;
          auVar73._0_8_ = uVar69;
          auVar73._16_8_ = uVar69;
          auVar73._24_8_ = uVar69;
          local_98 = vblendps_avx(auVar16,auVar73,0x24);
          auVar13 = vpermpd_avx2(ZEXT1632(auVar17),0xff);
          auVar68 = ZEXT1632(auVar18);
          auVar16 = vshufps_avx(auVar68,auVar68,0xf9);
          auVar16 = vpermpd_avx2(auVar16,0xea);
          auVar16 = vblendps_avx(auVar16,auVar13,0x24);
          auVar67 = ZEXT1632(auVar19);
          auVar13 = vpermpd_avx2(auVar67,0xf6);
          local_58 = vblendps_avx(auVar16,auVar13,0x92);
          auVar13 = vshufps_avx(auVar68,auVar68,0xf0);
          auVar16 = vshufpd_avx(ZEXT1632(auVar17),ZEXT1632(auVar17),1);
          auVar16 = vblendps_avx(auVar16,auVar13,0x24);
          auVar13 = vshufpd_avx(auVar67,auVar67,3);
          local_78 = vblendps_avx(auVar16,auVar13,0x49);
          lVar51 = 0;
          puVar33 = puVar48;
          do {
            uVar8 = *(uint *)(local_98 + lVar51 * 0xc);
            uVar69 = *(undefined8 *)(local_98 + lVar51 * 0xc + 4);
            puVar54 = &DAT_00318c04;
            lVar32 = 0;
            do {
              auVar70._0_4_ = (float)*puVar54 * (float)uVar69;
              auVar70._4_4_ = (float)((ulong)*puVar54 >> 0x20) * (float)((ulong)uVar69 >> 0x20);
              auVar70._8_8_ = 0;
              auVar17 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)puVar54 + -4)),auVar70,
                                        ZEXT416(uVar8));
              auVar70 = vmovshdup_avx(auVar70);
              puVar33[lVar32] = auVar17._0_4_ + auVar70._0_4_;
              lVar32 = lVar32 + 1;
              puVar54 = (undefined8 *)((long)puVar54 + 0xc);
            } while (lVar32 != 8);
            lVar51 = lVar51 + 1;
            puVar33 = puVar33 + 8;
          } while (lVar51 != 8);
          uVar29 = uVar29 + 1;
          puVar48 = (undefined4 *)
                    ((long)puVar48 +
                    (long)local_e8.w *
                    CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
        } while (uVar29 != (uint)inch);
      }
      uVar35 = uVar35 + 1;
    } while (uVar35 != (uint)outch);
  }
  Mat::create(kernel_tm_pack8,(uint)inch >> 3,0x40,(uint)outch >> 3,0x100,0x40,(Allocator *)0x0);
  if (7 < outch) {
    lVar21 = CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
    lVar25 = local_e8.cstep * lVar21;
    pvVar9 = kernel_tm_pack8->data;
    sVar10 = kernel_tm_pack8->elemsize;
    sVar11 = kernel_tm_pack8->cstep;
    iVar41 = kernel_tm_pack8->w;
    lVar51 = lVar25 * 8;
    lVar44 = lVar25 * 7;
    lVar34 = local_e8.w * lVar21;
    lVar50 = lVar25 * 2;
    lVar24 = lVar25 * 3;
    lVar32 = lVar25 * 4;
    lVar40 = lVar25 * 5;
    lVar53 = lVar25 * 6;
    uVar35 = 0;
    lVar28 = lVar25;
    puVar48 = (undefined4 *)local_e8.data;
    do {
      lVar36 = (long)local_e8.w;
      lVar52 = lVar21 * lVar36;
      lVar42 = lVar44 + (long)local_e8.data;
      lVar57 = lVar21 * 8 * lVar36;
      lVar43 = 0;
      local_2b0 = 0;
      local_2a8 = puVar48;
      do {
        if (7 < inch) {
          puVar49 = (undefined4 *)
                    ((long)pvVar9 +
                    (long)iVar41 * sVar10 * local_2b0 + (uVar35 >> 3) * sVar11 * sVar10);
          lVar26 = 7;
          lVar23 = (long)local_e8.data + lVar32;
          lVar31 = (long)local_e8.data + lVar50;
          puVar33 = local_2a8;
          lVar37 = lVar42;
          lVar39 = (long)local_e8.data + lVar24;
          lVar47 = (long)local_e8.data + lVar53;
          lVar55 = (long)local_e8.data + lVar28;
          lVar56 = (long)local_e8.data + lVar40;
          local_2a0 = lVar21 * 7 * lVar36 + lVar42;
          local_298 = lVar42 + lVar52;
          local_290 = lVar21 * 2 * lVar36 + lVar42;
          local_288 = lVar21 * 3 * lVar36 + lVar42;
          local_280 = lVar21 * 4 * lVar36 + lVar42;
          local_278 = lVar21 * 5 * lVar36 + lVar42;
          local_270 = lVar36 * lVar21 * 6 + lVar42;
          do {
            *puVar49 = *puVar33;
            puVar49[1] = *(undefined4 *)(lVar55 + lVar43);
            puVar49[2] = *(undefined4 *)(lVar31 + lVar43);
            puVar49[3] = *(undefined4 *)(lVar39 + lVar43);
            puVar49[4] = *(undefined4 *)(lVar23 + lVar43);
            puVar49[5] = *(undefined4 *)(lVar56 + lVar43);
            puVar49[6] = *(undefined4 *)(lVar47 + lVar43);
            puVar49[7] = *(undefined4 *)(lVar37 + lVar43);
            puVar49[8] = *(undefined4 *)((long)puVar33 + lVar34);
            lVar58 = lVar55 + lVar43 + lVar34;
            puVar49[9] = *(undefined4 *)(lVar34 + lVar55 + lVar43);
            lVar30 = lVar31 + lVar43 + lVar52;
            puVar49[10] = *(undefined4 *)(lVar52 + lVar31 + lVar43);
            puVar49[0xb] = *(undefined4 *)(lVar52 + lVar39 + lVar43);
            lVar38 = lVar39 + lVar43 + lVar52;
            puVar49[0xc] = *(undefined4 *)(lVar52 + lVar23 + lVar43);
            lVar22 = lVar23 + lVar43 + lVar52;
            puVar49[0xd] = *(undefined4 *)(lVar52 + lVar56 + lVar43);
            puVar49[0xe] = *(undefined4 *)(lVar52 + lVar47 + lVar43);
            lVar45 = lVar56 + lVar43 + lVar52;
            puVar49[0xf] = *(undefined4 *)(local_298 + lVar43);
            lVar27 = lVar47 + lVar43 + lVar52;
            puVar49[0x10] = *(undefined4 *)((long)puVar33 + lVar34 * 2);
            lVar59 = lVar58 + lVar34;
            puVar49[0x11] = *(undefined4 *)(lVar34 + lVar58);
            puVar49[0x12] = *(undefined4 *)(lVar52 + lVar30);
            lVar30 = lVar30 + lVar52;
            puVar49[0x13] = *(undefined4 *)(lVar52 + lVar38);
            lVar38 = lVar38 + lVar52;
            lVar58 = lVar22 + lVar52;
            puVar49[0x14] = *(undefined4 *)(lVar52 + lVar22);
            lVar46 = lVar45 + lVar52;
            puVar49[0x15] = *(undefined4 *)(lVar52 + lVar45);
            puVar49[0x16] = *(undefined4 *)(lVar52 + lVar27);
            lVar27 = lVar27 + lVar52;
            puVar49[0x17] = *(undefined4 *)(local_290 + lVar43);
            puVar49[0x18] = *(undefined4 *)((long)puVar33 + lVar34 * 3);
            puVar49[0x19] = *(undefined4 *)(lVar34 + lVar59);
            lVar59 = lVar59 + lVar34;
            puVar49[0x1a] = *(undefined4 *)(lVar52 + lVar30);
            lVar30 = lVar30 + lVar52;
            lVar45 = lVar38 + lVar52;
            puVar49[0x1b] = *(undefined4 *)(lVar52 + lVar38);
            lVar22 = lVar58 + lVar52;
            puVar49[0x1c] = *(undefined4 *)(lVar52 + lVar58);
            puVar49[0x1d] = *(undefined4 *)(lVar52 + lVar46);
            lVar46 = lVar46 + lVar52;
            puVar49[0x1e] = *(undefined4 *)(lVar52 + lVar27);
            lVar27 = lVar27 + lVar52;
            puVar49[0x1f] = *(undefined4 *)(local_288 + lVar43);
            puVar49[0x20] = puVar33[lVar34];
            puVar49[0x21] = *(undefined4 *)(lVar34 + lVar59);
            lVar59 = lVar59 + lVar34;
            puVar49[0x22] = *(undefined4 *)(lVar52 + lVar30);
            puVar49[0x23] = *(undefined4 *)(lVar52 + lVar45);
            lVar30 = lVar30 + lVar52;
            puVar49[0x24] = *(undefined4 *)(lVar52 + lVar22);
            lVar45 = lVar45 + lVar52;
            puVar49[0x25] = *(undefined4 *)(lVar52 + lVar46);
            puVar49[0x26] = *(undefined4 *)(lVar52 + lVar27);
            lVar22 = lVar22 + lVar52;
            puVar49[0x27] = *(undefined4 *)(local_280 + lVar43);
            lVar46 = lVar46 + lVar52;
            puVar49[0x28] = *(undefined4 *)((long)puVar33 + lVar34 * 5);
            puVar49[0x29] = *(undefined4 *)(lVar34 + lVar59);
            lVar27 = lVar27 + lVar52;
            puVar49[0x2a] = *(undefined4 *)(lVar52 + lVar30);
            puVar49[0x2b] = *(undefined4 *)(lVar52 + lVar45);
            puVar49[0x2c] = *(undefined4 *)(lVar52 + lVar22);
            lVar59 = lVar59 + lVar34;
            puVar49[0x2d] = *(undefined4 *)(lVar52 + lVar46);
            lVar30 = lVar30 + lVar52;
            puVar49[0x2e] = *(undefined4 *)(lVar52 + lVar27);
            puVar49[0x2f] = *(undefined4 *)(local_278 + lVar43);
            lVar45 = lVar45 + lVar52;
            puVar49[0x30] = *(undefined4 *)((long)puVar33 + lVar34 * 6);
            lVar22 = lVar22 + lVar52;
            puVar49[0x31] = *(undefined4 *)(lVar34 + lVar59);
            puVar49[0x32] = *(undefined4 *)(lVar52 + lVar30);
            lVar46 = lVar46 + lVar52;
            puVar49[0x33] = *(undefined4 *)(lVar52 + lVar45);
            lVar27 = lVar27 + lVar52;
            puVar49[0x34] = *(undefined4 *)(lVar52 + lVar22);
            puVar49[0x35] = *(undefined4 *)(lVar52 + lVar46);
            puVar49[0x36] = *(undefined4 *)(lVar52 + lVar27);
            puVar49[0x37] = *(undefined4 *)(local_270 + lVar43);
            puVar49[0x38] = *(undefined4 *)((long)puVar33 + lVar34 * 7);
            puVar49[0x39] = *(undefined4 *)(lVar59 + lVar34 * 2);
            puVar49[0x3a] = *(undefined4 *)(lVar30 + lVar52 * 2);
            puVar49[0x3b] = *(undefined4 *)(lVar45 + lVar52 * 2);
            puVar49[0x3c] = *(undefined4 *)(lVar22 + lVar52 * 2);
            puVar49[0x3d] = *(undefined4 *)(lVar46 + lVar52 * 2);
            puVar49[0x3e] = *(undefined4 *)(lVar27 + lVar52 * 2);
            puVar1 = (undefined4 *)(local_2a0 + lVar43);
            local_298 = local_298 + lVar57;
            local_290 = local_290 + lVar57;
            local_288 = local_288 + lVar57;
            local_280 = local_280 + lVar57;
            local_278 = local_278 + lVar57;
            puVar33 = puVar33 + lVar34 * 2;
            local_270 = local_270 + lVar57;
            lVar55 = lVar55 + lVar34 * 8;
            lVar31 = lVar31 + lVar57;
            lVar39 = lVar39 + lVar57;
            local_2a0 = local_2a0 + lVar57;
            lVar23 = lVar23 + lVar57;
            lVar56 = lVar56 + lVar57;
            lVar47 = lVar47 + lVar57;
            puVar49[0x3f] = *puVar1;
            lVar37 = lVar37 + lVar57;
            lVar26 = lVar26 + 8;
            puVar49 = puVar49 + 0x40;
          } while (lVar26 < inch);
        }
        local_2b0 = local_2b0 + 1;
        lVar43 = lVar43 + 4;
        local_2a8 = local_2a8 + 1;
      } while (local_2b0 != 0x40);
      uVar35 = uVar35 + 8;
      lVar44 = lVar44 + lVar51;
      puVar48 = puVar48 + lVar25 * 2;
      lVar28 = lVar28 + lVar51;
      lVar50 = lVar50 + lVar51;
      lVar24 = lVar24 + lVar51;
      lVar32 = lVar32 + lVar51;
      lVar40 = lVar40 + lVar51;
      lVar53 = lVar53 + lVar51;
    } while ((int)((uint)uVar35 | 7) < outch);
  }
  piVar20 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
  if (piVar20 != (int *)0x0) {
    LOCK();
    *piVar20 = *piVar20 + -1;
    UNLOCK();
    if (*piVar20 == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        if ((undefined4 *)local_e8.data != (undefined4 *)0x0) {
          free(local_e8.data);
        }
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd64_transform_kernel_pack8_avx(const Mat& kernel, Mat& kernel_tm_pack8, int inch, int outch, const Option& opt)
{
    // winograd63 transform kernel
    Mat kernel_tm;
    kernel_tm.create(8 * 8, inch, outch);

    const float ktm[8][3] = {
        {1.0f, 0.0f, 0.0f},
        {-2.0f / 9, -2.0f / 9, -2.0f / 9},
        {-2.0f / 9, 2.0f / 9, -2.0f / 9},
        {1.0f / 90, 1.0f / 45, 2.0f / 45},
        {1.0f / 90, -1.0f / 45, 2.0f / 45},
        {1.0f / 45, 1.0f / 90, 1.0f / 180},
        {1.0f / 45, -1.0f / 90, 1.0f / 180},
        {0.0f, 0.0f, 1.0f}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const float* kernel0 = (const float*)kernel + p * inch * 9 + q * 9;
            float* kernel_tm0 = kernel_tm.channel(p).row(q);

            // transform kernel, transposed
            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            // h
            float tmp[8][3];
            for (int i = 0; i < 8; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // v
            for (int j = 0; j < 8; j++)
            {
                float* tmpp = &tmp[j][0];

                for (int i = 0; i < 8; i++)
                {
                    kernel_tm0[j * 8 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }
    // interleave
    // src = 64-inch-outch
    // dst = 8b-8a-inch/8a-64-outch/8b;
    kernel_tm_pack8.create(inch / 8, 64, outch / 8, (size_t)4u * 64, 64);

    int q = 0;
    for (; q + 7 < outch; q += 8)
    {
        const Mat k0 = kernel_tm.channel(q);
        const Mat k1 = kernel_tm.channel(q + 1);
        const Mat k2 = kernel_tm.channel(q + 2);
        const Mat k3 = kernel_tm.channel(q + 3);
        const Mat k4 = kernel_tm.channel(q + 4);
        const Mat k5 = kernel_tm.channel(q + 5);
        const Mat k6 = kernel_tm.channel(q + 6);
        const Mat k7 = kernel_tm.channel(q + 7);

        Mat g0 = kernel_tm_pack8.channel(q / 8);

        for (int k = 0; k < 64; k++)
        {
            float* g00 = g0.row(k);

            for (int p = 0; p + 7 < inch; p += 8)
            {
                const float* k00 = k0.row(p);
                const float* k01 = k0.row(p + 1);
                const float* k02 = k0.row(p + 2);
                const float* k03 = k0.row(p + 3);
                const float* k04 = k0.row(p + 4);
                const float* k05 = k0.row(p + 5);
                const float* k06 = k0.row(p + 6);
                const float* k07 = k0.row(p + 7);

                const float* k10 = k1.row(p);
                const float* k11 = k1.row(p + 1);
                const float* k12 = k1.row(p + 2);
                const float* k13 = k1.row(p + 3);
                const float* k14 = k1.row(p + 4);
                const float* k15 = k1.row(p + 5);
                const float* k16 = k1.row(p + 6);
                const float* k17 = k1.row(p + 7);

                const float* k20 = k2.row(p);
                const float* k21 = k2.row(p + 1);
                const float* k22 = k2.row(p + 2);
                const float* k23 = k2.row(p + 3);
                const float* k24 = k2.row(p + 4);
                const float* k25 = k2.row(p + 5);
                const float* k26 = k2.row(p + 6);
                const float* k27 = k2.row(p + 7);

                const float* k30 = k3.row(p);
                const float* k31 = k3.row(p + 1);
                const float* k32 = k3.row(p + 2);
                const float* k33 = k3.row(p + 3);
                const float* k34 = k3.row(p + 4);
                const float* k35 = k3.row(p + 5);
                const float* k36 = k3.row(p + 6);
                const float* k37 = k3.row(p + 7);

                const float* k40 = k4.row(p);
                const float* k41 = k4.row(p + 1);
                const float* k42 = k4.row(p + 2);
                const float* k43 = k4.row(p + 3);
                const float* k44 = k4.row(p + 4);
                const float* k45 = k4.row(p + 5);
                const float* k46 = k4.row(p + 6);
                const float* k47 = k4.row(p + 7);

                const float* k50 = k5.row(p);
                const float* k51 = k5.row(p + 1);
                const float* k52 = k5.row(p + 2);
                const float* k53 = k5.row(p + 3);
                const float* k54 = k5.row(p + 4);
                const float* k55 = k5.row(p + 5);
                const float* k56 = k5.row(p + 6);
                const float* k57 = k5.row(p + 7);

                const float* k60 = k6.row(p);
                const float* k61 = k6.row(p + 1);
                const float* k62 = k6.row(p + 2);
                const float* k63 = k6.row(p + 3);
                const float* k64 = k6.row(p + 4);
                const float* k65 = k6.row(p + 5);
                const float* k66 = k6.row(p + 6);
                const float* k67 = k6.row(p + 7);

                const float* k70 = k7.row(p);
                const float* k71 = k7.row(p + 1);
                const float* k72 = k7.row(p + 2);
                const float* k73 = k7.row(p + 3);
                const float* k74 = k7.row(p + 4);
                const float* k75 = k7.row(p + 5);
                const float* k76 = k7.row(p + 6);
                const float* k77 = k7.row(p + 7);

                g00[0] = k00[k];
                g00[1] = k10[k];
                g00[2] = k20[k];
                g00[3] = k30[k];
                g00[4] = k40[k];
                g00[5] = k50[k];
                g00[6] = k60[k];
                g00[7] = k70[k];

                g00[8] = k01[k];
                g00[9] = k11[k];
                g00[10] = k21[k];
                g00[11] = k31[k];
                g00[12] = k41[k];
                g00[13] = k51[k];
                g00[14] = k61[k];
                g00[15] = k71[k];

                g00[16] = k02[k];
                g00[17] = k12[k];
                g00[18] = k22[k];
                g00[19] = k32[k];
                g00[20] = k42[k];
                g00[21] = k52[k];
                g00[22] = k62[k];
                g00[23] = k72[k];

                g00[24] = k03[k];
                g00[25] = k13[k];
                g00[26] = k23[k];
                g00[27] = k33[k];
                g00[28] = k43[k];
                g00[29] = k53[k];
                g00[30] = k63[k];
                g00[31] = k73[k];

                g00[32] = k04[k];
                g00[33] = k14[k];
                g00[34] = k24[k];
                g00[35] = k34[k];
                g00[36] = k44[k];
                g00[37] = k54[k];
                g00[38] = k64[k];
                g00[39] = k74[k];

                g00[40] = k05[k];
                g00[41] = k15[k];
                g00[42] = k25[k];
                g00[43] = k35[k];
                g00[44] = k45[k];
                g00[45] = k55[k];
                g00[46] = k65[k];
                g00[47] = k75[k];

                g00[48] = k06[k];
                g00[49] = k16[k];
                g00[50] = k26[k];
                g00[51] = k36[k];
                g00[52] = k46[k];
                g00[53] = k56[k];
                g00[54] = k66[k];
                g00[55] = k76[k];

                g00[56] = k07[k];
                g00[57] = k17[k];
                g00[58] = k27[k];
                g00[59] = k37[k];
                g00[60] = k47[k];
                g00[61] = k57[k];
                g00[62] = k67[k];
                g00[63] = k77[k];

                g00 += 64;
            }
        }
    }
}